

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::val::ValidationState_t::AddOrderedInstruction
          (ValidationState_t *this,spv_parsed_instruction_t *inst)

{
  pointer pIVar1;
  spv_parsed_instruction_t *local_10;
  
  local_10 = inst;
  std::vector<spvtools::val::Instruction,std::allocator<spvtools::val::Instruction>>::
  emplace_back<spv_parsed_instruction_t_const*&>
            ((vector<spvtools::val::Instruction,std::allocator<spvtools::val::Instruction>> *)
             &this->ordered_instructions_,&local_10);
  pIVar1 = (this->ordered_instructions_).
           super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar1[-1].line_num_ =
       ((long)pIVar1 -
       (long)(this->ordered_instructions_).
             super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x88;
  return pIVar1 + -1;
}

Assistant:

Instruction* ValidationState_t::AddOrderedInstruction(
    const spv_parsed_instruction_t* inst) {
  ordered_instructions_.emplace_back(inst);
  ordered_instructions_.back().SetLineNum(ordered_instructions_.size());
  return &ordered_instructions_.back();
}